

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

void __thiscall UtestShell::print(UtestShell *this,char *text,char *fileName,size_t lineNumber)

{
  TestResult *pTVar1;
  char *pcVar2;
  UtestShell *this_00;
  SimpleString stringToPrint;
  SimpleString local_40;
  SimpleString local_30;
  
  SimpleString::SimpleString(&local_40,"\n");
  SimpleString::operator+=(&local_40,fileName);
  SimpleString::operator+=(&local_40,":");
  ::StringFrom((unsigned_long)&local_30);
  SimpleString::operator+=(&local_40,&local_30);
  SimpleString::~SimpleString(&local_30);
  SimpleString::operator+=(&local_40," ");
  this_00 = (UtestShell *)&local_40;
  SimpleString::operator+=((SimpleString *)this_00,text);
  pTVar1 = getTestResult(this_00);
  pcVar2 = SimpleString::asCharString(&local_40);
  (*pTVar1->_vptr_TestResult[0xe])(pTVar1,pcVar2);
  SimpleString::~SimpleString(&local_40);
  return;
}

Assistant:

void UtestShell::print(const char *text, const char* fileName, size_t lineNumber)
{
    SimpleString stringToPrint = "\n";
    stringToPrint += fileName;
    stringToPrint += ":";
    stringToPrint += StringFrom(lineNumber);
    stringToPrint += " ";
    stringToPrint += text;
    getTestResult()->print(stringToPrint.asCharString());
}